

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureDescription::clear_type(FeatureDescription *this)

{
  FeatureType *this_00;
  Arena *pAVar1;
  FeatureDescription *this_local;
  
  pAVar1 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  if (((pAVar1 == (Arena *)0x0) && (this->type_ != (FeatureType *)0x0)) &&
     (this_00 = this->type_, this_00 != (FeatureType *)0x0)) {
    FeatureType::~FeatureType(this_00);
    operator_delete(this_00,0x28);
  }
  this->type_ = (FeatureType *)0x0;
  return;
}

Assistant:

void FeatureDescription::clear_type() {
  if (GetArenaForAllocation() == nullptr && type_ != nullptr) {
    delete type_;
  }
  type_ = nullptr;
}